

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::RemoveUserDefinedCommands(cmState *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  *this_00;
  _Base_ptr __n;
  mapped_type pcVar1;
  char cVar2;
  int iVar3;
  _Base_ptr p_Var4;
  mapped_type *ppcVar5;
  _Self __tmp;
  iterator __position;
  cmCommand **ppcVar6;
  bool bVar7;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> renamedCommands;
  cmCommand **local_98;
  iterator iStack_90;
  cmCommand **local_88;
  string local_78;
  _Base_ptr local_58;
  string local_50;
  
  local_98 = (cmCommand **)0x0;
  iStack_90._M_current = (cmCommand **)0x0;
  local_88 = (cmCommand **)0x0;
  this_00 = &this->Commands;
  __position._M_node = (this->Commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = &(this->Commands)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (__position._M_node != local_58) {
    do {
      cVar2 = (**(code **)(**(long **)(__position._M_node + 2) + 0x18))
                        (*(long **)(__position._M_node + 2),"cmMacroHelperCommand");
      p_Var4 = __position._M_node + 2;
      if ((cVar2 == '\0') &&
         (iVar3 = (*((*(cmCommand **)p_Var4)->super_cmObject)._vptr_cmObject[3])
                            (*(cmCommand **)p_Var4,"cmFunctionHelperCommand"), (char)iVar3 == '\0'))
      {
        (*((*(cmCommand **)p_Var4)->super_cmObject)._vptr_cmObject[0xb])(&local_78);
        __n = __position._M_node[1]._M_parent;
        bVar7 = true;
        if (__n == (_Base_ptr)local_78._M_string_length) {
          if (__n == (_Base_ptr)0x0) {
            bVar7 = false;
          }
          else {
            iVar3 = bcmp(*(void **)(__position._M_node + 1),local_78._M_dataplus._M_p,(size_t)__n);
            bVar7 = iVar3 != 0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          if (iStack_90._M_current == local_88) {
            std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*const&>
                      ((vector<cmCommand*,std::allocator<cmCommand*>> *)&local_98,iStack_90,
                       (cmCommand **)p_Var4);
          }
          else {
            *iStack_90._M_current = *(cmCommand **)p_Var4;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
          ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                              *)this_00,__position);
        }
        else {
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
      }
      else {
        if (*(cmCommand **)p_Var4 != (cmCommand *)0x0) {
          (*((*(cmCommand **)p_Var4)->super_cmObject)._vptr_cmObject[1])();
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                            *)this_00,__position);
      }
      __position._M_node = p_Var4;
    } while (p_Var4 != local_58);
  }
  if (local_98 != iStack_90._M_current) {
    ppcVar6 = local_98;
    do {
      pcVar1 = *ppcVar6;
      (*((*ppcVar6)->super_cmObject)._vptr_cmObject[0xb])(&local_50);
      cmsys::SystemTools::LowerCase(&local_78,&local_50);
      ppcVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
                ::operator[](this_00,&local_78);
      *ppcVar5 = pcVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != iStack_90._M_current);
  }
  if (local_98 != (cmCommand **)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

cmState::~cmState()
{
  delete this->CacheManager;
  cmDeleteAll(this->Commands);
}